

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

AssertionResult __thiscall
testing::internal::EqFailure
          (internal *this,char *lhs_expression,char *rhs_expression,string *lhs_value,
          string *rhs_value,bool ignoring_case)

{
  ostream *poVar1;
  int iVar2;
  size_t sVar3;
  AssertionResult *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  undefined3 in_register_00000089;
  AssertionResult AVar5;
  undefined1 local_a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lhs_lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rhs_lines;
  string local_68;
  undefined4 local_44;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_44 = CONCAT31(in_register_00000089,ignoring_case);
  Message::Message((Message *)&local_40);
  local_38 = local_40.ptr_;
  poVar1 = (ostream *)(local_40.ptr_ + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"      Expected: ",0x10);
  if (lhs_expression == (char *)0x0) {
    sVar3 = 6;
    lhs_expression = "(null)";
  }
  else {
    sVar3 = strlen(lhs_expression);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,lhs_expression,sVar3);
  iVar2 = std::__cxx11::string::compare((char *)lhs_value);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n      Which is: ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(lhs_value->_M_dataplus)._M_p,lhs_value->_M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nTo be equal to: ",0x11);
  if (rhs_expression == (char *)0x0) {
    sVar3 = 6;
    rhs_expression = "(null)";
  }
  else {
    sVar3 = strlen(rhs_expression);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,rhs_expression,sVar3);
  iVar2 = std::__cxx11::string::compare((char *)rhs_value);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n      Which is: ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(rhs_value->_M_dataplus)._M_p,rhs_value->_M_string_length);
  }
  if ((char)local_44 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nIgnoring case",0xe);
  }
  if ((lhs_value->_M_string_length != 0) && (rhs_value->_M_string_length != 0)) {
    anon_unknown_96::SplitEscapedString
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a0,lhs_value);
    anon_unknown_96::SplitEscapedString
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&lhs_lines.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,rhs_value);
    if ((0x20 < (ulong)((long)lhs_lines.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)local_a0)) ||
       (0x20 < (ulong)((long)rhs_lines.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start -
                      (long)lhs_lines.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage))) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nWith diff:\n",0xc);
      edit_distance::CreateUnifiedDiff
                (&local_68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&lhs_lines.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(char *)CONCAT71(local_68._M_dataplus._M_p._1_7_,
                                         local_68._M_dataplus._M_p._0_1_),local_68._M_string_length)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_68._M_dataplus._M_p._1_7_,local_68._M_dataplus._M_p._0_1_) !=
          &local_68.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_68._M_dataplus._M_p._1_7_,local_68._M_dataplus._M_p._0_1_),
                        local_68.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&lhs_lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a0);
  }
  local_68._M_dataplus._M_p._0_1_ = 0;
  local_68._M_string_length = 0;
  other = AssertionResult::operator<<((AssertionResult *)&local_68,(Message *)&local_40);
  AssertionResult::AssertionResult((AssertionResult *)this,other);
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar4.ptr_ = extraout_RDX;
  if (local_40.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_40.ptr_ + 8))();
    sVar4.ptr_ = extraout_RDX_00;
  }
  AVar5.message_.ptr_ = sVar4.ptr_;
  AVar5._0_8_ = this;
  return AVar5;
}

Assistant:

AssertionResult EqFailure(const char* lhs_expression,
                          const char* rhs_expression,
                          const std::string& lhs_value,
                          const std::string& rhs_value,
                          bool ignoring_case) {
  Message msg;
  msg << "      Expected: " << lhs_expression;
  if (lhs_value != lhs_expression) {
    msg << "\n      Which is: " << lhs_value;
  }
  msg << "\nTo be equal to: " << rhs_expression;
  if (rhs_value != rhs_expression) {
    msg << "\n      Which is: " << rhs_value;
  }

  if (ignoring_case) {
    msg << "\nIgnoring case";
  }

  if (!lhs_value.empty() && !rhs_value.empty()) {
    const std::vector<std::string> lhs_lines =
        SplitEscapedString(lhs_value);
    const std::vector<std::string> rhs_lines =
        SplitEscapedString(rhs_value);
    if (lhs_lines.size() > 1 || rhs_lines.size() > 1) {
      msg << "\nWith diff:\n"
          << edit_distance::CreateUnifiedDiff(lhs_lines, rhs_lines);
    }
  }

  return AssertionFailure() << msg;
}